

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void __thiscall Rml::DataExpression::~DataExpression(DataExpression *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  ::std::
  vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
  ::~vector(&this->addresses);
  ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::~vector
            (&this->program);
  pcVar1 = (this->expression)._M_dataplus._M_p;
  paVar2 = &(this->expression).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

DataExpression::~DataExpression() {}